

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

DiskFileToVirtualFileResult __thiscall
google::protobuf::compiler::DiskSourceTree::DiskFileToVirtualFile
          (DiskSourceTree *this,string *disk_file,string *virtual_file,string *shadowing_disk_file)

{
  pointer pMVar1;
  bool bVar2;
  int iVar3;
  ZeroCopyInputStream *pZVar4;
  DiskFileToVirtualFileResult DVar5;
  long lVar6;
  DiskSourceTree *this_00;
  int i;
  ulong uVar7;
  string canonical_disk_file;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)disk_file);
  CanonicalizePath(&canonical_disk_file,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  lVar6 = 0;
  for (uVar7 = 0;
      pMVar1 = (this->mappings_).
               super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(this->mappings_).
                            super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 6);
      uVar7 = uVar7 + 1) {
    this_00 = (DiskSourceTree *)&canonical_disk_file;
    bVar2 = ApplyMapping(&canonical_disk_file,
                         (string *)((long)&(pMVar1->disk_path)._M_dataplus._M_p + lVar6),
                         (string *)((long)&(pMVar1->virtual_path)._M_dataplus._M_p + lVar6),
                         virtual_file);
    if (bVar2) {
      lVar6 = 0x20;
      goto LAB_002d38a9;
    }
    lVar6 = lVar6 + 0x40;
  }
  DVar5 = NO_MAPPING;
LAB_002d390e:
  std::__cxx11::string::~string((string *)&canonical_disk_file);
  return DVar5;
LAB_002d38a9:
  bVar2 = uVar7 == 0;
  uVar7 = uVar7 - 1;
  if (bVar2) goto LAB_002d38e1;
  pMVar1 = (this->mappings_).
           super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (DiskSourceTree *)virtual_file;
  bVar2 = ApplyMapping(virtual_file,(string *)((long)pMVar1 + lVar6 + -0x20),
                       (string *)((long)&(pMVar1->virtual_path)._M_dataplus._M_p + lVar6),
                       shadowing_disk_file);
  if (bVar2) {
    this_00 = (DiskSourceTree *)(shadowing_disk_file->_M_dataplus)._M_p;
    iVar3 = access((char *)this_00,0);
    if (-1 < iVar3) {
      DVar5 = SHADOWED;
      goto LAB_002d390e;
    }
  }
  lVar6 = lVar6 + 0x40;
  goto LAB_002d38a9;
LAB_002d38e1:
  shadowing_disk_file->_M_string_length = 0;
  *(shadowing_disk_file->_M_dataplus)._M_p = '\0';
  pZVar4 = OpenDiskFile(this_00,disk_file);
  if (pZVar4 == (ZeroCopyInputStream *)0x0) {
    DVar5 = CANNOT_OPEN;
  }
  else {
    (*pZVar4->_vptr_ZeroCopyInputStream[1])(pZVar4);
    DVar5 = SUCCESS;
  }
  goto LAB_002d390e;
}

Assistant:

DiskSourceTree::DiskFileToVirtualFileResult
DiskSourceTree::DiskFileToVirtualFile(
    const string& disk_file,
    string* virtual_file,
    string* shadowing_disk_file) {
  int mapping_index = -1;
  string canonical_disk_file = CanonicalizePath(disk_file);

  for (int i = 0; i < mappings_.size(); i++) {
    // Apply the mapping in reverse.
    if (ApplyMapping(canonical_disk_file, mappings_[i].disk_path,
                     mappings_[i].virtual_path, virtual_file)) {
      // Success.
      mapping_index = i;
      break;
    }
  }

  if (mapping_index == -1) {
    return NO_MAPPING;
  }

  // Iterate through all mappings with higher precedence and verify that none
  // of them map this file to some other existing file.
  for (int i = 0; i < mapping_index; i++) {
    if (ApplyMapping(*virtual_file, mappings_[i].virtual_path,
                     mappings_[i].disk_path, shadowing_disk_file)) {
      if (access(shadowing_disk_file->c_str(), F_OK) >= 0) {
        // File exists.
        return SHADOWED;
      }
    }
  }
  shadowing_disk_file->clear();

  // Verify that we can open the file.  Note that this also has the side-effect
  // of verifying that we are not canonicalizing away any non-existent
  // directories.
  google::protobuf::scoped_ptr<io::ZeroCopyInputStream> stream(OpenDiskFile(disk_file));
  if (stream == NULL) {
    return CANNOT_OPEN;
  }

  return SUCCESS;
}